

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::convert_non_uniform_expression
          (CompilerGLSL *this,string *expr,uint32_t ptr_id)

{
  ulong uVar1;
  bool bVar2;
  uint32_t id;
  ulong uVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  string local_e0 [48];
  string local_b0 [32];
  spirv_cross local_90 [32];
  string local_70;
  ulong local_50;
  size_t index;
  ulong uStack_40;
  uint bracket_count;
  size_t end_array_index;
  size_type start_array_index;
  SPIRType *backing_type;
  SPIRVariable *var;
  string *psStack_18;
  uint32_t ptr_id_local;
  string *expr_local;
  CompilerGLSL *this_local;
  
  if (((*(this->backend).nonuniform_qualifier != '\0') &&
      (var._4_4_ = ptr_id, psStack_18 = expr, expr_local = (string *)this,
      backing_type = (SPIRType *)Compiler::maybe_get_backing_variable(&this->super_Compiler,ptr_id),
      backing_type != (SPIRType *)0x0)) &&
     ((backing_type->basetype == Unknown ||
      ((backing_type->basetype == Half || (backing_type->basetype == Boolean)))))) {
    id = TypedID::operator_cast_to_unsigned_int
                   ((TypedID *)&(backing_type->super_IVariant).field_0xc);
    start_array_index = (size_type)Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,id);
    bVar2 = VectorView<unsigned_int>::empty
                      (&(((SPIRType *)start_array_index)->array).super_VectorView<unsigned_int>);
    if ((!bVar2) &&
       (end_array_index = ::std::__cxx11::string::find_first_of((char)psStack_18,0x5b),
       end_array_index != 0xffffffffffffffff)) {
      uStack_40 = 0xffffffffffffffff;
      index._4_4_ = 1;
      local_50 = end_array_index;
      do {
        while( true ) {
          local_50 = local_50 + 1;
          uVar1 = local_50;
          uVar3 = ::std::__cxx11::string::size();
          if (uVar3 <= uVar1) goto LAB_00536d20;
          pcVar4 = (char *)::std::__cxx11::string::operator[]((ulong)psStack_18);
          if (*pcVar4 == ']') break;
          pcVar4 = (char *)::std::__cxx11::string::operator[]((ulong)psStack_18);
          if (*pcVar4 == '[') {
            index._4_4_ = index._4_4_ + 1;
          }
        }
        index._4_4_ = index._4_4_ + -1;
      } while (index._4_4_ != 0);
      uStack_40 = local_50;
LAB_00536d20:
      if (index._4_4_ != 0) {
        __assert_fail("bracket_count == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_glsl.cpp"
                      ,0x4767,
                      "void spirv_cross::CompilerGLSL::convert_non_uniform_expression(string &, uint32_t)"
                     );
      }
      if (((end_array_index != 0xffffffffffffffff) && (uStack_40 != 0xffffffffffffffff)) &&
         (end_array_index <= uStack_40)) {
        end_array_index = end_array_index + 1;
        ::std::__cxx11::string::substr((ulong)local_90,(ulong)psStack_18);
        ::std::__cxx11::string::substr((ulong)local_b0,(ulong)psStack_18);
        ::std::__cxx11::string::substr((ulong)local_e0,(ulong)psStack_18);
        join<std::__cxx11::string,char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[2],std::__cxx11::string>
                  (&local_70,local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(this->backend).nonuniform_qualifier,(char **)0x676d60,(char (*) [2])local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x682405,
                   (char (*) [2])local_e0,in_stack_ffffffffffffff00);
        ::std::__cxx11::string::operator=((string *)psStack_18,(string *)&local_70);
        ::std::__cxx11::string::~string((string *)&local_70);
        ::std::__cxx11::string::~string(local_e0);
        ::std::__cxx11::string::~string(local_b0);
        ::std::__cxx11::string::~string((string *)local_90);
      }
    }
  }
  return;
}

Assistant:

void CompilerGLSL::convert_non_uniform_expression(string &expr, uint32_t ptr_id)
{
	if (*backend.nonuniform_qualifier == '\0')
		return;

	auto *var = maybe_get_backing_variable(ptr_id);
	if (!var)
		return;

	if (var->storage != StorageClassUniformConstant &&
	    var->storage != StorageClassStorageBuffer &&
	    var->storage != StorageClassUniform)
		return;

	auto &backing_type = get<SPIRType>(var->basetype);
	if (backing_type.array.empty())
		return;

	// If we get here, we know we're accessing an arrayed resource which
	// might require nonuniform qualifier.

	auto start_array_index = expr.find_first_of('[');

	if (start_array_index == string::npos)
		return;

	// We've opened a bracket, track expressions until we can close the bracket.
	// This must be our resource index.
	size_t end_array_index = string::npos;
	unsigned bracket_count = 1;
	for (size_t index = start_array_index + 1; index < expr.size(); index++)
	{
		if (expr[index] == ']')
		{
			if (--bracket_count == 0)
			{
				end_array_index = index;
				break;
			}
		}
		else if (expr[index] == '[')
			bracket_count++;
	}

	assert(bracket_count == 0);

	// Doesn't really make sense to declare a non-arrayed image with nonuniformEXT, but there's
	// nothing we can do here to express that.
	if (start_array_index == string::npos || end_array_index == string::npos || end_array_index < start_array_index)
		return;

	start_array_index++;

	expr = join(expr.substr(0, start_array_index), backend.nonuniform_qualifier, "(",
	            expr.substr(start_array_index, end_array_index - start_array_index), ")",
	            expr.substr(end_array_index, string::npos));
}